

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseInstr(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  Enum EVar4;
  pointer *__ptr;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var5;
  _Head_base<0UL,_wabt::Expr_*,_false> local_28;
  _Head_base<0UL,_wabt::Expr_*,_false> local_20;
  _Head_base<0UL,_wabt::Expr_*,_false> local_18;
  
  TVar2 = Peek(this,0);
  bVar1 = anon_unknown_1::IsPlainInstr(TVar2);
  if (bVar1) {
    local_28._M_head_impl = (Expr *)0x0;
    RVar3 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_28);
    if (RVar3.enum_ == Error) {
      EVar4 = Error;
      _Var5._M_head_impl = local_28._M_head_impl;
    }
    else {
      local_20._M_head_impl = local_28._M_head_impl;
      local_28._M_head_impl = (Expr *)0x0;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_20);
      if (local_20._M_head_impl != (Expr *)0x0) {
        (*(local_20._M_head_impl)->_vptr_Expr[1])();
      }
      local_20._M_head_impl = (Expr *)0x0;
      EVar4 = Ok;
      _Var5._M_head_impl = local_28._M_head_impl;
    }
  }
  else {
    TVar2 = Peek(this,0);
    if ((0x3c < TVar2 - Block) ||
       ((0x1800000008400001U >> ((ulong)(TVar2 - Block) & 0x3f) & 1) == 0)) {
      bVar1 = PeekMatchExpr(this);
      if (!bVar1) {
        __assert_fail("!\"ParseInstr should only be called when IsInstr() is true\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x85d,"Result wabt::WastParser::ParseInstr(ExprList *)");
      }
      RVar3 = ParseExpr(this,exprs);
      return (Result)RVar3.enum_;
    }
    local_28._M_head_impl = (Expr *)0x0;
    RVar3 = ParseBlockInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_28);
    if (RVar3.enum_ == Error) {
      EVar4 = Error;
      _Var5._M_head_impl = local_28._M_head_impl;
    }
    else {
      local_18._M_head_impl = local_28._M_head_impl;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_18);
      EVar4 = Ok;
      _Var5._M_head_impl = local_18._M_head_impl;
    }
  }
  if (_Var5._M_head_impl != (Expr *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseInstr(ExprList* exprs) {
  WABT_TRACE(ParseInstr);
  if (IsPlainInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (IsBlockInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParseBlockInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (PeekMatchExpr()) {
    return ParseExpr(exprs);
  } else {
    assert(!"ParseInstr should only be called when IsInstr() is true");
    return Result::Error;
  }
}